

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::MasteringMetadata::Valid(MasteringMetadata *this)

{
  float fVar1;
  PrimaryChromaticity *pPVar2;
  float fVar3;
  
  fVar1 = this->luminance_min_;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    if (fVar1 < 0.0) {
      return false;
    }
    if (999.99 < fVar1) {
      return false;
    }
    fVar3 = this->luminance_max_;
    if (fVar3 < fVar1) {
      return false;
    }
  }
  else {
    fVar3 = this->luminance_max_;
  }
  if ((((((fVar3 == 3.4028235e+38) && (!NAN(fVar3))) ||
        ((fVar1 <= fVar3 && ((0.0 <= fVar3 && (fVar3 <= 9999.99)))))) &&
       ((pPVar2 = this->r_, pPVar2 == (PrimaryChromaticity *)0x0 ||
        ((((0.0 <= pPVar2->x_ && (pPVar2->x_ <= 1.0)) && (0.0 <= pPVar2->y_)) && (pPVar2->y_ <= 1.0)
         ))))) &&
      (((pPVar2 = this->g_, pPVar2 == (PrimaryChromaticity *)0x0 ||
        (((0.0 <= pPVar2->x_ && (pPVar2->x_ <= 1.0)) && ((0.0 <= pPVar2->y_ && (pPVar2->y_ <= 1.0)))
         ))) && ((pPVar2 = this->b_, pPVar2 == (PrimaryChromaticity *)0x0 ||
                 (((0.0 <= pPVar2->x_ && (pPVar2->x_ <= 1.0)) &&
                  ((0.0 <= pPVar2->y_ && (pPVar2->y_ <= 1.0)))))))))) &&
     ((pPVar2 = this->white_point_, pPVar2 == (PrimaryChromaticity *)0x0 ||
      ((((0.0 <= pPVar2->x_ && (pPVar2->x_ <= 1.0)) && (0.0 <= pPVar2->y_)) && (pPVar2->y_ <= 1.0)))
      ))) {
    return true;
  }
  return false;
}

Assistant:

bool MasteringMetadata::Valid() const {
  if (luminance_min_ != kValueNotPresent) {
    if (luminance_min_ < kMinLuminance || luminance_min_ > kMinLuminanceMax ||
        luminance_min_ > luminance_max_) {
      return false;
    }
  }
  if (luminance_max_ != kValueNotPresent) {
    if (luminance_max_ < kMinLuminance || luminance_max_ > kMaxLuminanceMax ||
        luminance_max_ < luminance_min_) {
      return false;
    }
  }
  if (r_ && !r_->Valid())
    return false;
  if (g_ && !g_->Valid())
    return false;
  if (b_ && !b_->Valid())
    return false;
  if (white_point_ && !white_point_->Valid())
    return false;

  return true;
}